

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::Close(TCPSocket *this)

{
  mutex *__mutex;
  bool bVar1;
  Poller *pPVar2;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  __weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 auStack_40 [8];
  shared_ptr<hwnet::util::Timer> sp;
  
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  if (((this->closed)._M_base._M_i & 1U) == 0) {
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)auStack_40);
    if (auStack_40 != (undefined1  [8])0x0) {
      util::Timer::cancel((Timer *)auStack_40);
      std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
    this->recvTimeout = 0;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              (&this->recvTimeoutCallback_,(nullptr_t)0x0);
    this->sendTimeout = 0;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              (&this->sendTimeoutCallback_,(nullptr_t)0x0);
    LOCK();
    (this->closed)._M_base._M_i = true;
    UNLOCK();
    shutdown(this->fd,2);
    pPVar2 = this->poller_;
    local_48 = (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>;
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_58,local_48);
    auStack_40 = (undefined1  [8])
                 &(local_58->super_enable_shared_from_this<hwnet::util::Timer>)._M_weak_this.
                  super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (local_58 == (element_type *)0x0) {
      auStack_40 = (undefined1  [8])0x0;
    }
    sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Stack_50._M_pi;
    local_58 = (element_type *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::Remove(pPVar2,(Ptr *)auStack_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    if ((this->closeCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      bVar1 = this->doing;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (bVar1 != false) {
        return;
      }
      pPVar2 = this->poller_;
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_58,local_48);
      auStack_40 = (undefined1  [8])local_58;
      sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_50._M_pi;
      local_58 = (element_type *)0x0;
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::PostTask(pPVar2,(Ptr *)auStack_40,this->pool_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
      return;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void TCPSocket::Close() {
	
	auto post = false;
	{	
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this->closed) {
			return;
		}

		if(auto sp = this->timer.lock()) {
			sp->cancel();
			this->timer.reset();
		}

		this->recvTimeout = 0;
		this->recvTimeoutCallback_ = nullptr;

		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;


		this->closed.store(true);
		::shutdown(this->fd,SHUT_RDWR);
		poller_->Remove(shared_from_this());	

		if(this->closeCallback_ && !this->doing){
			post = true;
		}
	}
	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}	
}